

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

bool chaiscript::AST_Node::get_bool_condition(Boxed_Value *t_bv)

{
  Result_Type RVar1;
  
  RVar1 = boxed_cast<bool>(t_bv,(Type_Conversions_State *)0x0);
  return RVar1;
}

Assistant:

static bool get_bool_condition(const Boxed_Value &t_bv) {
        try {
          return boxed_cast<bool>(t_bv);
        }
        catch (const exception::bad_boxed_cast &) {
          throw exception::eval_error("Condition not boolean");
        }
      }